

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<double>::resize_impl(QVLABase<double> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  QVLABase<double> *this_00;
  qsizetype in_RCX;
  void *in_RSI;
  QVLABaseBase *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  qsizetype in_stack_00000008;
  QVLABaseBase *prealloc_00;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  prealloc_00 = in_RDI;
  local_10 = in_RCX;
  this_00 = (QVLABase<double> *)QVLABaseBase::capacity(in_RDI);
  qMax<long_long>(&local_10,(longlong *)&stack0xffffffffffffffe8);
  reallocate_impl(this_00,(qsizetype)prealloc_00,in_RSI,in_stack_00000008,unaff_retaddr);
  in_RDI->s = local_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }